

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

char * cmsys::SystemTools::AppendStrings(char *str1,char *str2,char *str3)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *str1_00;
  
  pcVar4 = str3;
  str1_00 = str2;
  if (((str1 != (char *)0x0) && (str1_00 = str1, str2 != (char *)0x0)) &&
     (pcVar4 = str2, str3 != (char *)0x0)) {
    sVar1 = strlen(str1);
    sVar2 = strlen(str2);
    sVar3 = strlen(str3);
    pcVar4 = (char *)operator_new__(sVar3 + sVar1 + sVar2 + 1);
    strcpy(pcVar4,str1);
    strcat(pcVar4 + sVar1,str2);
    strcat(pcVar4 + sVar1 + sVar2,str3);
    return pcVar4;
  }
  pcVar4 = AppendStrings(str1_00,pcVar4);
  return pcVar4;
}

Assistant:

char* SystemTools::AppendStrings(const char* str1, const char* str2,
                                 const char* str3)
{
  if (!str1) {
    return SystemTools::AppendStrings(str2, str3);
  }
  if (!str2) {
    return SystemTools::AppendStrings(str1, str3);
  }
  if (!str3) {
    return SystemTools::AppendStrings(str1, str2);
  }

  size_t len1 = strlen(str1), len2 = strlen(str2);
  char* newstr = new char[len1 + len2 + strlen(str3) + 1];
  if (!newstr) {
    return nullptr;
  }
  strcpy(newstr, str1);
  strcat(newstr + len1, str2);
  strcat(newstr + len1 + len2, str3);
  return newstr;
}